

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

error<idx2::err_code> idx2::WriteVolume(FILE *Fp,volume *Vol,grid *Grid)

{
  size_t sVar1;
  error<idx2::err_code> eVar2;
  FILE *local_688;
  err_code local_680;
  undefined2 uStack_67c;
  anon_class_1_0_00000001 local_671;
  FILE *local_670;
  err_code local_668;
  undefined2 uStack_664;
  anon_class_1_0_00000001 local_659;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_658;
  grid_iterator<unsigned_char> It_9;
  grid_iterator<unsigned_char> EndIt_9;
  err_code local_5e0;
  undefined2 uStack_5dc;
  anon_class_1_0_00000001 local_5d1;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_5d0;
  grid_iterator<signed_char> It_8;
  grid_iterator<signed_char> EndIt_8;
  err_code local_558;
  undefined2 uStack_554;
  anon_class_1_0_00000001 local_549;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_548;
  grid_iterator<unsigned_short> It_7;
  grid_iterator<unsigned_short> EndIt_7;
  err_code local_4d0;
  undefined2 uStack_4cc;
  anon_class_1_0_00000001 local_4c1;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_4c0;
  grid_iterator<short> It_6;
  grid_iterator<short> EndIt_6;
  err_code local_448;
  undefined2 uStack_444;
  anon_class_1_0_00000001 local_439;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_438;
  grid_iterator<unsigned_int> It_5;
  grid_iterator<unsigned_int> EndIt_5;
  err_code local_3c0;
  undefined2 uStack_3bc;
  anon_class_1_0_00000001 local_3b1;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_3b0;
  grid_iterator<int> It_4;
  grid_iterator<int> EndIt_4;
  err_code local_338;
  undefined2 uStack_334;
  anon_class_1_0_00000001 local_329;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_328;
  grid_iterator<unsigned_long> It_3;
  grid_iterator<unsigned_long> EndIt_3;
  err_code local_2b0;
  undefined2 uStack_2ac;
  anon_class_1_0_00000001 local_2a1;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_2a0;
  grid_iterator<long> It_2;
  grid_iterator<long> EndIt_2;
  err_code local_228;
  undefined2 uStack_224;
  anon_class_1_0_00000001 local_219;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_218;
  grid_iterator<float> It_1;
  grid_iterator<float> EndIt_1;
  err_code local_1a0;
  undefined2 uStack_19c;
  anon_class_1_0_00000001 local_191;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_190;
  grid_iterator<double> It;
  grid_iterator<double> EndIt;
  grid *Grid_local;
  volume *Vol_local;
  FILE *Fp_local;
  err_code local_100;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  
  if (Vol->Type == float64) {
    End<double>((grid_iterator<double> *)((long)&It.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
    Begin<double>((grid_iterator<double> *)&local_190.field_0,Grid,Vol);
    while (local_190 != (anon_union_8_4_6ba14846_for_v2<int>_1)It.N.field_0.field_4.YZ.field_0) {
      sVar1 = fwrite((void *)local_190,8,1,(FILE *)Fp);
      if (sVar1 != 1) {
        eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_191);
        EndIt_1.N.field_0.field_4.YZ.field_0 = (v2<int>)eVar2.Msg;
        Fp_local = (FILE *)EndIt_1.N.field_0.field_4.YZ.field_0;
        local_1a0 = eVar2.Code;
        local_100 = local_1a0;
        uStack_19c = eVar2._12_2_;
        uStack_fc = uStack_19c;
        goto LAB_0029158c;
      }
      grid_iterator<double>::operator++((grid_iterator<double> *)&local_190.field_0);
    }
  }
  else if (Vol->Type == float32) {
    End<float>((grid_iterator<float> *)((long)&It_1.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
    Begin<float>((grid_iterator<float> *)&local_218.field_0,Grid,Vol);
    while (local_218 != (anon_union_8_4_6ba14846_for_v2<int>_1)It_1.N.field_0.field_4.YZ.field_0) {
      sVar1 = fwrite((void *)local_218,4,1,(FILE *)Fp);
      if (sVar1 != 1) {
        eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_219);
        EndIt_2.N.field_0.field_4.YZ.field_0 = (v2<int>)eVar2.Msg;
        Fp_local = (FILE *)EndIt_2.N.field_0.field_4.YZ.field_0;
        local_228 = eVar2.Code;
        local_100 = local_228;
        uStack_224 = eVar2._12_2_;
        uStack_fc = uStack_224;
        goto LAB_0029158c;
      }
      grid_iterator<float>::operator++((grid_iterator<float> *)&local_218.field_0);
    }
  }
  else if (Vol->Type == int64) {
    End<long>((grid_iterator<long> *)((long)&It_2.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
    Begin<long>((grid_iterator<long> *)&local_2a0.field_0,Grid,Vol);
    while (local_2a0 != (anon_union_8_4_6ba14846_for_v2<int>_1)It_2.N.field_0.field_4.YZ.field_0) {
      sVar1 = fwrite((void *)local_2a0,8,1,(FILE *)Fp);
      if (sVar1 != 1) {
        eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_2a1);
        EndIt_3.N.field_0.field_4.YZ.field_0 = (v2<int>)eVar2.Msg;
        Fp_local = (FILE *)EndIt_3.N.field_0.field_4.YZ.field_0;
        local_2b0 = eVar2.Code;
        local_100 = local_2b0;
        uStack_2ac = eVar2._12_2_;
        uStack_fc = uStack_2ac;
        goto LAB_0029158c;
      }
      grid_iterator<long>::operator++((grid_iterator<long> *)&local_2a0.field_0);
    }
  }
  else if (Vol->Type == uint64) {
    End<unsigned_long>((grid_iterator<unsigned_long> *)
                       ((long)&It_3.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
    Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_328.field_0,Grid,Vol);
    while (local_328 != (anon_union_8_4_6ba14846_for_v2<int>_1)It_3.N.field_0.field_4.YZ.field_0) {
      sVar1 = fwrite((void *)local_328,8,1,(FILE *)Fp);
      if (sVar1 != 1) {
        eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_329);
        EndIt_4.N.field_0.field_4.YZ.field_0 = (v2<int>)eVar2.Msg;
        Fp_local = (FILE *)EndIt_4.N.field_0.field_4.YZ.field_0;
        local_338 = eVar2.Code;
        local_100 = local_338;
        uStack_334 = eVar2._12_2_;
        uStack_fc = uStack_334;
        goto LAB_0029158c;
      }
      grid_iterator<unsigned_long>::operator++((grid_iterator<unsigned_long> *)&local_328.field_0);
    }
  }
  else if (Vol->Type == int32) {
    End<int>((grid_iterator<int> *)((long)&It_4.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
    Begin<int>((grid_iterator<int> *)&local_3b0.field_0,Grid,Vol);
    while (local_3b0 != (anon_union_8_4_6ba14846_for_v2<int>_1)It_4.N.field_0.field_4.YZ.field_0) {
      sVar1 = fwrite((void *)local_3b0,4,1,(FILE *)Fp);
      if (sVar1 != 1) {
        eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_3b1);
        EndIt_5.N.field_0.field_4.YZ.field_0 = (v2<int>)eVar2.Msg;
        Fp_local = (FILE *)EndIt_5.N.field_0.field_4.YZ.field_0;
        local_3c0 = eVar2.Code;
        local_100 = local_3c0;
        uStack_3bc = eVar2._12_2_;
        uStack_fc = uStack_3bc;
        goto LAB_0029158c;
      }
      grid_iterator<int>::operator++((grid_iterator<int> *)&local_3b0.field_0);
    }
  }
  else if (Vol->Type == uint32) {
    End<unsigned_int>((grid_iterator<unsigned_int> *)((long)&It_5.N.field_0.field_3.XY.field_0 + 4),
                      Grid,Vol);
    Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_438.field_0,Grid,Vol);
    while (local_438 != (anon_union_8_4_6ba14846_for_v2<int>_1)It_5.N.field_0.field_4.YZ.field_0) {
      sVar1 = fwrite((void *)local_438,4,1,(FILE *)Fp);
      if (sVar1 != 1) {
        eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_439);
        EndIt_6.N.field_0.field_4.YZ.field_0 = (v2<int>)eVar2.Msg;
        Fp_local = (FILE *)EndIt_6.N.field_0.field_4.YZ.field_0;
        local_448 = eVar2.Code;
        local_100 = local_448;
        uStack_444 = eVar2._12_2_;
        uStack_fc = uStack_444;
        goto LAB_0029158c;
      }
      grid_iterator<unsigned_int>::operator++((grid_iterator<unsigned_int> *)&local_438.field_0);
    }
  }
  else if (Vol->Type == int16) {
    End<short>((grid_iterator<short> *)((long)&It_6.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
    Begin<short>((grid_iterator<short> *)&local_4c0.field_0,Grid,Vol);
    while (local_4c0 != (anon_union_8_4_6ba14846_for_v2<int>_1)It_6.N.field_0.field_4.YZ.field_0) {
      sVar1 = fwrite((void *)local_4c0,2,1,(FILE *)Fp);
      if (sVar1 != 1) {
        eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_4c1);
        EndIt_7.N.field_0.field_4.YZ.field_0 = (v2<int>)eVar2.Msg;
        Fp_local = (FILE *)EndIt_7.N.field_0.field_4.YZ.field_0;
        local_4d0 = eVar2.Code;
        local_100 = local_4d0;
        uStack_4cc = eVar2._12_2_;
        uStack_fc = uStack_4cc;
        goto LAB_0029158c;
      }
      grid_iterator<short>::operator++((grid_iterator<short> *)&local_4c0.field_0);
    }
  }
  else if (Vol->Type == uint16) {
    End<unsigned_short>((grid_iterator<unsigned_short> *)
                        ((long)&It_7.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
    Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_548.field_0,Grid,Vol);
    while (local_548 != (anon_union_8_4_6ba14846_for_v2<int>_1)It_7.N.field_0.field_4.YZ.field_0) {
      sVar1 = fwrite((void *)local_548,2,1,(FILE *)Fp);
      if (sVar1 != 1) {
        eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_549);
        EndIt_8.N.field_0.field_4.YZ.field_0 = (v2<int>)eVar2.Msg;
        Fp_local = (FILE *)EndIt_8.N.field_0.field_4.YZ.field_0;
        local_558 = eVar2.Code;
        local_100 = local_558;
        uStack_554 = eVar2._12_2_;
        uStack_fc = uStack_554;
        goto LAB_0029158c;
      }
      grid_iterator<unsigned_short>::operator++((grid_iterator<unsigned_short> *)&local_548.field_0)
      ;
    }
  }
  else if (Vol->Type == int8) {
    End<signed_char>((grid_iterator<signed_char> *)((long)&It_8.N.field_0.field_3.XY.field_0 + 4),
                     Grid,Vol);
    Begin<signed_char>((grid_iterator<signed_char> *)&local_5d0.field_0,Grid,Vol);
    while (local_5d0 != (anon_union_8_4_6ba14846_for_v2<int>_1)It_8.N.field_0.field_4.YZ.field_0) {
      sVar1 = fwrite((void *)local_5d0,1,1,(FILE *)Fp);
      if (sVar1 != 1) {
        eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_5d1);
        EndIt_9.N.field_0.field_4.YZ.field_0 = (v2<int>)eVar2.Msg;
        Fp_local = (FILE *)EndIt_9.N.field_0.field_4.YZ.field_0;
        local_5e0 = eVar2.Code;
        local_100 = local_5e0;
        uStack_5dc = eVar2._12_2_;
        uStack_fc = uStack_5dc;
        goto LAB_0029158c;
      }
      grid_iterator<signed_char>::operator++((grid_iterator<signed_char> *)&local_5d0.field_0);
    }
  }
  else if (Vol->Type == uint8) {
    End<unsigned_char>((grid_iterator<unsigned_char> *)
                       ((long)&It_9.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
    Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_658.field_0,Grid,Vol);
    while (local_658 != (anon_union_8_4_6ba14846_for_v2<int>_1)It_9.N.field_0.field_4.YZ.field_0) {
      sVar1 = fwrite((void *)local_658,1,1,(FILE *)Fp);
      if (sVar1 != 1) {
        eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_659);
        local_670 = (FILE *)eVar2.Msg;
        Fp_local = local_670;
        local_668 = eVar2.Code;
        local_100 = local_668;
        uStack_664 = eVar2._12_2_;
        uStack_fc = uStack_664;
        goto LAB_0029158c;
      }
      grid_iterator<unsigned_char>::operator++((grid_iterator<unsigned_char> *)&local_658.field_0);
    }
  }
  eVar2 = WriteVolume::anon_class_1_0_00000001::operator()(&local_671);
  local_688 = (FILE *)eVar2.Msg;
  Fp_local = local_688;
  local_680 = eVar2.Code;
  local_100 = local_680;
  uStack_67c = eVar2._12_2_;
  uStack_fc = uStack_67c;
LAB_0029158c:
  eVar2.Code = local_100;
  eVar2.Msg = (cstr)Fp_local;
  eVar2.StackIdx = (undefined1)uStack_fc;
  eVar2.StrGened = (bool)uStack_fc._1_1_;
  eVar2._14_2_ = uStack_fa;
  return eVar2;
}

Assistant:

error<>
WriteVolume(FILE* Fp, const volume& Vol, const grid& Grid)
{
#define Body(type)                                                                                 \
  auto EndIt = End<type>(Grid, Vol);                                                               \
  for (auto It = Begin<type>(Grid, Vol); It != EndIt; ++It)                                        \
  {                                                                                                \
    if (fwrite(&(*It), sizeof(*It), 1, Fp) != 1)                                                   \
      return idx2_Error(err_code::FileWriteFailed);                                                \
  }
  idx2_DispatchOnType(Vol.Type) return idx2_Error(err_code::NoError);
#undef Body
}